

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitStringNew
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,StringNew *curr)

{
  size_t sVar1;
  char *pcVar2;
  uint uVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  long lVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  Literal *x;
  undefined1 local_2e0 [8];
  Flow start;
  undefined1 local_158 [8];
  Flow ptr;
  Flow end;
  Literals contents;
  Literal local_88;
  Literal local_70;
  Literal *local_58;
  long local_50;
  shared_ptr<wasm::GCData> ptrData;
  long local_38;
  
  visit((Flow *)local_158,this,*(Expression **)(curr + 0x18));
  pcVar2 = PRINT;
  sVar1 = NONCONSTANT_FLOW;
  if (ptr.breakTo.super_IString.str._M_len == 0) {
    if (*(int *)(curr + 0x10) == 2) {
      Flow::getSingleValue((Flow *)local_158);
      uVar3 = wasm::Literal::getUnsigned();
      if (0x10ffff < uVar3) {
        (*this->_vptr_ExpressionRunner[2])(this,"invalid code point");
      }
      std::__cxx11::stringstream::stringstream((stringstream *)local_2e0);
      wasm::String::writeWTF16CodePoint
                ((ostream *)&start.values.super_SmallVector<wasm::Literal,_1UL>.fixed,uVar3);
      std::__cxx11::stringbuf::str();
      wasm::Literal::Literal
                (&local_70,end.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed,
                 ptr.breakTo.super_IString.str._M_str);
      Flow::Flow(__return_storage_ptr__,&local_70);
      wasm::Literal::~Literal(&local_70);
      std::__cxx11::string::~string((string *)&ptr.breakTo.super_IString.str._M_str);
      std::__cxx11::stringstream::~stringstream((stringstream *)local_2e0);
    }
    else if (*(int *)(curr + 0x10) == 1) {
      visit((Flow *)local_2e0,this,*(Expression **)(curr + 0x20));
      if (start.breakTo.super_IString.str._M_len == 0) {
        visit((Flow *)&ptr.breakTo.super_IString.str._M_str,this,*(Expression **)(curr + 0x28));
        if (end.breakTo.super_IString.str._M_len == 0) {
          Flow::getSingleValue((Flow *)local_158);
          wasm::Literal::getGCData();
          local_38 = local_50;
          if (local_50 == 0) {
            (*this->_vptr_ExpressionRunner[2])(this,"null ref");
            local_38 = local_50;
          }
          Flow::getSingleValue((Flow *)local_2e0);
          p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)wasm::Literal::getUnsigned();
          Flow::getSingleValue((Flow *)&ptr.breakTo.super_IString.str._M_str);
          ptrData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)wasm::Literal::getUnsigned();
          lVar5 = *(long *)(local_38 + 0x30) - *(long *)(local_38 + 0x28);
          p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   (lVar5 / 0x18 + *(long *)(local_38 + 8));
          if (((p_Var6 < p_Var4) ||
              (ptrData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi < p_Var4)) ||
             (p_Var6 < ptrData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi)) {
            (*this->_vptr_ExpressionRunner[2])(this,"array oob",lVar5 % 0x18);
          }
          end.breakTo.super_IString.str._M_str = (char *)0x0;
          if (p_Var4 <= ptrData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi &&
              (long)ptrData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                    ._M_pi - (long)p_Var4 != 0) {
            SmallVector<wasm::Literal,_1UL>::reserve
                      ((SmallVector<wasm::Literal,_1UL> *)&end.breakTo.super_IString.str._M_str,
                       (long)ptrData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi - (long)p_Var4);
            local_58 = (Literal *)(local_38 + 0x10);
            lVar5 = (long)p_Var4 * 0x18 + -0x18;
            for (; p_Var4 < ptrData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi;
                p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         ((long)&p_Var4->_vptr__Sp_counted_base + 1)) {
              x = (Literal *)(*(long *)(local_38 + 0x28) + lVar5);
              if (p_Var4 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                x = local_58;
              }
              SmallVector<wasm::Literal,_1UL>::push_back
                        ((SmallVector<wasm::Literal,_1UL> *)&end.breakTo.super_IString.str._M_str,x)
              ;
              lVar5 = lVar5 + 0x18;
            }
          }
          makeGCData(&local_88,this,(Literals *)&end.breakTo.super_IString.str._M_str,
                     (Type)*(uintptr_t *)(curr + 8));
          Flow::Flow(__return_storage_ptr__,&local_88);
          wasm::Literal::~Literal(&local_88);
          SmallVector<wasm::Literal,_1UL>::~SmallVector
                    ((SmallVector<wasm::Literal,_1UL> *)&end.breakTo.super_IString.str._M_str);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&ptrData);
        }
        else {
          Flow::Flow(__return_storage_ptr__,(Flow *)&ptr.breakTo.super_IString.str._M_str);
        }
        SmallVector<wasm::Literal,_1UL>::~SmallVector
                  ((SmallVector<wasm::Literal,_1UL> *)&ptr.breakTo.super_IString.str._M_str);
      }
      else {
        Flow::Flow(__return_storage_ptr__,(Flow *)local_2e0);
      }
      SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_2e0);
    }
    else {
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
      field_0.func.super_IString.str._M_str = (char *)0x0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.
      id = 0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
      field_0.i64 = 0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->breakTo).super_IString.str._M_len = sVar1;
      (__return_storage_ptr__->breakTo).super_IString.str._M_str = pcVar2;
    }
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_158);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_158);
  return __return_storage_ptr__;
}

Assistant:

Flow visitStringNew(StringNew* curr) {
    Flow ptr = visit(curr->ref);
    if (ptr.breaking()) {
      return ptr;
    }
    switch (curr->op) {
      case StringNewWTF16Array: {
        Flow start = visit(curr->start);
        if (start.breaking()) {
          return start;
        }
        Flow end = visit(curr->end);
        if (end.breaking()) {
          return end;
        }
        auto ptrData = ptr.getSingleValue().getGCData();
        if (!ptrData) {
          trap("null ref");
        }
        const auto& ptrDataValues = ptrData->values;
        size_t startVal = start.getSingleValue().getUnsigned();
        size_t endVal = end.getSingleValue().getUnsigned();
        if (startVal > ptrDataValues.size() || endVal > ptrDataValues.size() ||
            endVal < startVal) {
          trap("array oob");
        }
        Literals contents;
        if (endVal > startVal) {
          contents.reserve(endVal - startVal);
          for (size_t i = startVal; i < endVal; i++) {
            contents.push_back(ptrDataValues[i]);
          }
        }
        return makeGCData(std::move(contents), curr->type);
      }
      case StringNewFromCodePoint: {
        uint32_t codePoint = ptr.getSingleValue().getUnsigned();
        if (codePoint > 0x10FFFF) {
          trap("invalid code point");
        }
        std::stringstream wtf16;
        String::writeWTF16CodePoint(wtf16, codePoint);
        std::string str = wtf16.str();
        return Literal(str);
      }
      default:
        // TODO: others
        return Flow(NONCONSTANT_FLOW);
    }
  }